

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

bool __thiscall OPLmusicBlock::ServiceStream(OPLmusicBlock *this,void *buff,int numbytes)

{
  double dVar1;
  OPLEmul *pOVar2;
  OPLio *pOVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  ulong uStack_50;
  int next;
  size_t i;
  int samplesleft;
  int tick_in;
  double ticky;
  uint local_30;
  bool res;
  bool prevEnded;
  int numsamples;
  int stereoshift;
  float *samples1;
  int numbytes_local;
  void *buff_local;
  OPLmusicBlock *this_local;
  
  bVar4 = this->FullPan & 1U | ((this->super_musicBlock).io)->IsOPL3 & 1U;
  local_30 = (uint)((ulong)(long)numbytes / (ulong)(4L << bVar4));
  bVar5 = false;
  ticky._6_1_ = true;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->ChipAccess);
  _numsamples = (float *)buff;
LAB_0040b994:
  do {
    if ((int)local_30 < 1) goto LAB_0040bc5d;
    dVar1 = this->NextTickIn;
    uVar6 = MIN<int>(local_30,(int)this->NextTickIn);
    if (0 < (int)uVar6) {
      for (uStack_50 = 0; uStack_50 < ((this->super_musicBlock).io)->NumChips;
          uStack_50 = uStack_50 + 1) {
        pOVar2 = ((this->super_musicBlock).io)->chips[uStack_50];
        (*pOVar2->_vptr_OPLEmul[4])(pOVar2,_numsamples,(ulong)uVar6);
      }
      OffsetSamples(this,_numsamples,uVar6 << bVar4);
      if ((this->NextTickIn != dVar1) || (NAN(this->NextTickIn) || NAN(dVar1))) {
        __assert_fail("NextTickIn == ticky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0xf4,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      this->NextTickIn = this->NextTickIn - (double)(int)uVar6;
      if (this->NextTickIn < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0xf6,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      local_30 = local_30 - uVar6;
      _numsamples = _numsamples + (int)(uVar6 << bVar4);
    }
  } while (1.0 < this->NextTickIn || this->NextTickIn == 1.0);
  uVar6 = (*this->_vptr_OPLmusicBlock[3])();
  if ((int)uVar6 < 0) {
    __assert_fail("next >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                  ,0xfe,"bool OPLmusicBlock::ServiceStream(void *, int)");
  }
  if (uVar6 != 0) {
    bVar5 = false;
    pOVar3 = (this->super_musicBlock).io;
    (*pOVar3->_vptr_OPLio[6])(pOVar3,(ulong)uVar6);
    this->NextTickIn = this->SamplesPerTick * (double)(int)uVar6 + this->NextTickIn;
    if (this->NextTickIn < 0.0) {
      __assert_fail("NextTickIn >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                    ,0x11a,"bool OPLmusicBlock::ServiceStream(void *, int)");
    }
    (this->super_musicBlock).MLtime = (long)(int)uVar6 + (this->super_musicBlock).MLtime;
    goto LAB_0040b994;
  }
  if (((this->Looping & 1U) != 0) && (!bVar5)) {
    bVar5 = true;
    (*this->_vptr_OPLmusicBlock[2])();
    goto LAB_0040b994;
  }
  if (0 < (int)local_30) {
    for (uStack_50 = 0; uStack_50 < ((this->super_musicBlock).io)->NumChips;
        uStack_50 = uStack_50 + 1) {
      pOVar2 = ((this->super_musicBlock).io)->chips[uStack_50];
      (*pOVar2->_vptr_OPLEmul[4])(pOVar2,_numsamples,(ulong)local_30);
    }
    OffsetSamples(this,_numsamples,local_30 << bVar4);
  }
  ticky._6_1_ = false;
LAB_0040bc5d:
  FCriticalSection::Leave(&this->ChipAccess);
  return ticky._6_1_;
}

Assistant:

bool OPLmusicBlock::ServiceStream (void *buff, int numbytes)
{
	float *samples1 = (float *)buff;
	int stereoshift = (int)(FullPan | io->IsOPL3);
	int numsamples = numbytes / (sizeof(float) << stereoshift);
	bool prevEnded = false;
	bool res = true;

	memset(buff, 0, numbytes);

	ChipAccess.Enter();
	while (numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);
		size_t i;

		if (samplesleft > 0)
		{
			for (i = 0; i < io->NumChips; ++i)
			{
				io->chips[i]->Update(samples1, samplesleft);
			}
			OffsetSamples(samples1, samplesleft << stereoshift);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert (NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft << stereoshift;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (!Looping || prevEnded)
				{
					if (numsamples > 0)
					{
						for (i = 0; i < io->NumChips; ++i)
						{
							io->chips[i]->Update(samples1, numsamples);
						}
						OffsetSamples(samples1, numsamples << stereoshift);
					}
					res = false;
					break;
				}
				else
				{
					// Avoid infinite loops from songs that do nothing but end
					prevEnded = true;
					Restart ();
				}
			}
			else
			{
				prevEnded = false;
				io->WriteDelay(next);
				NextTickIn += SamplesPerTick * next;
				assert (NextTickIn >= 0);
				MLtime += next;
			}
		}
	}
	ChipAccess.Leave();
	return res;
}